

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs::function&>(holder<cs::callable> *this,function *args)

{
  _Any_data local_30;
  _Manager_type local_20;
  _Invoker_type p_Stack_18;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_00254520;
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs::function&,void>
            ((function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)> *)
             local_30._M_pod_data,args);
  *(undefined8 *)&(this->mDat).mFunc.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = 0;
  (this->mDat).mFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).mFunc._M_invoker = p_Stack_18;
  if (local_20 != (_Manager_type)0x0) {
    *(void **)&(this->mDat).mFunc.super__Function_base._M_functor = local_30._M_unused._M_object;
    *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = local_30._8_8_;
    (this->mDat).mFunc.super__Function_base._M_manager = local_20;
    local_20 = (_Manager_type)0x0;
    p_Stack_18 = (_Invoker_type)0x0;
  }
  (this->mDat).mType = normal;
  if (local_20 != (_Manager_type)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}